

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.h
# Opt level: O1

expected<void,_std::error_code> * __thiscall
jaegertracing::Tracer::Inject
          (expected<void,_std::error_code> *__return_storage_ptr__,Tracer *this,SpanContext *ctx,
          HTTPHeadersWriter *writer)

{
  element_type *peVar1;
  int iVar2;
  error_category *peVar3;
  long lVar4;
  
  lVar4 = __dynamic_cast(ctx,&opentracing::v3::SpanContext::typeinfo,&SpanContext::typeinfo,0);
  peVar3 = DAT_00280788;
  iVar2 = opentracing::v3::invalid_span_context_error;
  if (lVar4 == 0) {
    __return_storage_ptr__->has_value_ = false;
    (__return_storage_ptr__->contained).m_error._M_value = iVar2;
    (__return_storage_ptr__->contained).m_error._M_cat = peVar3;
  }
  else {
    peVar1 = (this->_httpHeaderPropagator).
             super___shared_ptr<jaegertracing::propagation::Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*(peVar1->super_Extractor<const_opentracing::v3::HTTPHeadersReader_&>)._vptr_Extractor[3])
              (peVar1,lVar4,writer);
    __return_storage_ptr__->has_value_ = true;
  }
  return __return_storage_ptr__;
}

Assistant:

opentracing::expected<void>
    Inject(const opentracing::SpanContext& ctx,
           const opentracing::HTTPHeadersWriter& writer) const override
    {
        const auto* jaegerCtx = dynamic_cast<const SpanContext*>(&ctx);
        if (!jaegerCtx) {
            return opentracing::make_expected_from_error<void>(
                opentracing::invalid_span_context_error);
        }
        _httpHeaderPropagator->inject(*jaegerCtx, writer);
        return opentracing::make_expected();
    }